

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_trace.c
# Opt level: O0

int trace_downrec(jit_State *J)

{
  bool bVar1;
  jit_State *J_local;
  
  bVar1 = (*J->pc & 0xff) != 0x49;
  if (bVar1) {
    J->parent = 0;
    J->exitno = 0;
    J->state = LJ_TRACE_RECORD;
    trace_start(J);
  }
  J_local._4_4_ = (uint)bVar1;
  return J_local._4_4_;
}

Assistant:

static int trace_downrec(jit_State *J)
{
  /* Restart recording at the return instruction. */
  lj_assertJ(J->pt != NULL, "no active prototype");
  lj_assertJ(bc_isret(bc_op(*J->pc)), "not at a return bytecode");
  if (bc_op(*J->pc) == BC_RETM)
    return 0;  /* NYI: down-recursion with RETM. */
  J->parent = 0;
  J->exitno = 0;
  J->state = LJ_TRACE_RECORD;
  trace_start(J);
  return 1;
}